

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O0

double GetTimeElapsedChronoQuick(CHRONO *pChrono)

{
  long lVar1;
  undefined1 local_28 [8];
  timespec temp;
  CHRONO *pChrono_local;
  
  if (pChrono->Suspended == 0) {
    temp.tv_nsec = (__syscall_slong_t)pChrono;
    clock_gettime(4,(timespec *)local_28);
    lVar1 = *(long *)(temp.tv_nsec + 0x28) + temp.tv_sec;
    local_28 = (undefined1  [8])
               ((lVar1 / 1000000000 + *(long *)(temp.tv_nsec + 0x20) + (long)local_28) -
               *(long *)temp.tv_nsec);
    temp.tv_sec = lVar1 % 1000000000 - *(long *)(temp.tv_nsec + 8);
    if (temp.tv_sec < 0) {
      local_28 = (undefined1  [8])(temp.tv_sec / 1000000000 + -1 + (long)local_28);
      temp.tv_sec = temp.tv_sec % 1000000000 + 1000000000;
    }
    pChrono_local = (CHRONO *)((double)(long)local_28 + (double)temp.tv_sec / 1000000000.0);
  }
  else {
    pChrono_local =
         (CHRONO *)
         ((double)(pChrono->Duration).tv_sec + (double)(pChrono->Duration).tv_nsec / 1000000000.0);
  }
  return (double)pChrono_local;
}

Assistant:

inline double GetTimeElapsedChronoQuick(CHRONO* pChrono)
{
	struct timespec temp;

	if (pChrono->Suspended)
	{
		return pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}
	else
	{
		clock_gettime(CLOCK_MONOTONIC_RAW, &temp);

		//*pDuration = pChrono->Duration+temp-pChrono->Start

		temp.tv_sec += pChrono->Duration.tv_sec; // Seconds.
		temp.tv_nsec += pChrono->Duration.tv_nsec; // Additional nanoseconds.
		// tv_nsec must stay in [0,1000000000].
		temp.tv_sec += temp.tv_nsec/1000000000;
		temp.tv_nsec = temp.tv_nsec%1000000000;

		temp.tv_sec -= pChrono->Start.tv_sec;
		temp.tv_nsec -= pChrono->Start.tv_nsec;
		// tv_nsec must stay in [0,1000000000].
		if (temp.tv_nsec < 0)
		{
			temp.tv_sec += -1+temp.tv_nsec/1000000000;
			temp.tv_nsec = 1000000000+temp.tv_nsec%1000000000;
		}

		return temp.tv_sec+(double)temp.tv_nsec/1000000000.0;
	}
}